

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestQueue.cpp
# Opt level: O2

void anon_unknown.dwarf_16501c::writeq(QueueWriter *w,size_t size)

{
  char *pcVar1;
  bool bVar2;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s;
  Result *in_R9;
  unique_ptr<char[],_std::default_delete<char[]>_> buf;
  ExpressionDecomposer local_4c;
  Result local_48;
  
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4c,DT_REQUIRE);
  bVar2 = binlog::detail::QueueWriter::beginWrite(w,size);
  buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 ((ulong)bVar2 | (ulong)local_4c.m_at << 0x20);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_48,(Expression_lhs *)&buf);
  doctest::detail::decomp_assert
            ((detail *)0xc,0x191760,(char *)0x11,0x19192d,&local_48.m_passed,in_R9);
  doctest::String::~String(&local_48.m_decomp);
  __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(size);
  memset((void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,0,size);
  buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  memset(w->_writePos,0,size);
  pcVar1 = w->_writePos;
  w->_writePos = pcVar1 + size;
  (w->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(pcVar1 + size) - (long)w->_queue->buffer;
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buf);
  return;
}

Assistant:

void writeq(binlog::detail::QueueWriter& w, std::size_t size)
{
  REQUIRE(w.beginWrite(size));

  std::unique_ptr<char[]> buf(new char[size]());
  w.writeBuffer(buf.get(), size);
  w.endWrite();
}